

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bstrlib.c
# Opt level: O2

int bvcformata(bstring b,int count,char *fmt,__va_list_tag *arg)

{
  uint uVar1;
  uchar *puVar2;
  int iVar3;
  int iVar4;
  size_t sVar5;
  int iVar6;
  
  iVar6 = -1;
  if ((((0 < count) && (b != (bstring)0x0)) && (fmt != (char *)0x0)) &&
     (((b->data != (uchar *)0x0 && (0 < b->mlen)) && (uVar1 = b->slen, uVar1 <= (uint)b->mlen)))) {
    iVar3 = balloc(b,count + uVar1 + 2);
    if (iVar3 == 0) {
      iVar3 = vsnprintf((char *)(b->data + b->slen),(ulong)(count + 2),fmt,arg);
      b->data[(long)count + (long)b->slen + 2] = '\0';
      iVar6 = b->slen;
      puVar2 = b->data;
      sVar5 = strlen((char *)(puVar2 + iVar6));
      iVar4 = (int)sVar5 + iVar6;
      if ((int)(uVar1 + count) < iVar4) {
        puVar2[iVar6] = '\0';
        iVar6 = 0x7fffffff;
        if ((uint)count < 0x40000000) {
          iVar6 = count * 2;
        }
        if (count + 1 < iVar3) {
          iVar6 = iVar3;
        }
        iVar6 = -iVar6;
      }
      else {
        b->slen = iVar4;
        iVar6 = 0;
      }
    }
  }
  return iVar6;
}

Assistant:

int bvcformata (bstring b, int count, const char * fmt, va_list arg) {
int n, r, l;

	if (b == NULL || fmt == NULL || count <= 0 || b->data == NULL
	 || b->mlen <= 0 || b->slen < 0 || b->slen > b->mlen) return BSTR_ERR;

	if (count > (n = b->slen + count) + 2) return BSTR_ERR;
	if (BSTR_OK != balloc (b, n + 2)) return BSTR_ERR;

	exvsnprintf (r, (char *) b->data + b->slen, count + 2, fmt, arg);
	b->data[b->slen + count + 2] = '\0';

	/* Did the operation complete successfully within bounds? */

	if (n >= (l = b->slen + (int) (strlen) ((char *) b->data + b->slen))) {
		b->slen = l;
		return BSTR_OK;
	}

	/* Abort, since the buffer was not large enough.  The return value
	   tries to help set what the retry length should be. */

	b->data[b->slen] = '\0';
	if (r > count+1) {
		l = r;
	} else {
		if (count > INT_MAX / 2)
			l = INT_MAX;
		else
			l = count + count;
	}
	n = -l;
	if (n > BSTR_ERR-1) n = BSTR_ERR-1;
	return n;
}